

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

QString * __thiscall QCoreApplicationPrivate::appName(QCoreApplicationPrivate *this)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  QString *other;
  char **in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  char *p;
  QString *applicationName;
  QByteArrayView *this_00;
  QByteArrayView in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_data = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x1a6be1);
  bVar2 = QString::isEmpty((QString *)0x1a6beb);
  if ((bVar2) && (*(long *)in_RSI[2] != 0)) {
    pcVar3 = strrchr(*(char **)in_RSI[2],0x2f);
    if (pcVar3 == (char *)0x0) {
      other = *(QString **)in_RSI[2];
    }
    else {
      other = (QString *)(pcVar3 + 1);
    }
    QByteArrayView::QByteArrayView<char_*,_true>(this_00,in_RSI);
    QString::fromLocal8Bit(in_stack_ffffffffffffffe8);
    QString::operator=((QString *)in_RDI,other);
    QString::~QString((QString *)0x1a6c8e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QCoreApplicationPrivate::appName() const
{
    QString applicationName;
#ifdef Q_OS_DARWIN
    applicationName = infoDictionaryStringProperty(QStringLiteral("CFBundleName"));
#endif
    if (applicationName.isEmpty() && argv[0]) {
        char *p = strrchr(argv[0], '/');
        applicationName = QString::fromLocal8Bit(p ? p + 1 : argv[0]);
    }

    return applicationName;
}